

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.c
# Opt level: O0

int load_shell(char *sh)

{
  int *piVar1;
  char *pcVar2;
  undefined1 local_a8 [8];
  char slavename [128];
  int local_20;
  int local_1c;
  int fd;
  pid_t pid;
  char *sh_local;
  
  _fd = sh;
  local_1c = forkpty(&local_20,local_a8,0);
  if (local_1c < 0) {
    if ((loglevel & 1U) != 0) {
      piVar1 = __errno_location();
      pcVar2 = strerror(*piVar1);
      syslog(3,"forkpty: %s\n",pcVar2);
    }
    sh_local._4_4_ = -1;
  }
  else {
    if (local_1c == 0) {
      execl(_fd,"sh",0);
    }
    sh_local._4_4_ = local_20;
  }
  return sh_local._4_4_;
}

Assistant:

int load_shell(const char *sh) 
{
    pid_t pid;
    int fd/*, oflags*/;
    //struct termios options;
    char slavename[128];
    if((pid = forkpty(&fd, slavename, NULL, NULL)) < 0) {
        LOGE("forkpty: %s\n", strerror(errno));
        return -1;
    } else if(pid == 0) {
        execl(sh, "sh", NULL);
    }
    /*
    // get the parameters
    tcgetattr(fd, &options);
    cfmakeraw(&options);

    tcsetattr(fd, TCSANOW, &options);

    oflags = fcntl(fd, F_GETFL);
    oflags |= (O_NONBLOCK | O_NOCTTY);
    fcntl(fd, F_SETFL, oflags);
    */

    return fd;
}